

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLExportTest_writeStringTest_Test::TestBody
          (OpenDDLExportTest_writeStringTest_Test *this)

{
  bool bVar1;
  Value *this_00;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_e8;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  string statement;
  undefined1 local_60 [6];
  bool ok;
  Value *local_30;
  Value *v;
  char tempString [5];
  OpenDDLExportMock myExport;
  OpenDDLExportTest_writeStringTest_Test *this_local;
  
  OpenDDLExportMock::OpenDDLExportMock((OpenDDLExportMock *)tempString);
  v._4_1_ = 0;
  v._0_4_ = 0x75687568;
  this_00 = ValueAllocator::allocPrimData(ddl_string,5);
  local_30 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,(char *)&v,(allocator<char> *)(statement.field_2._M_local_buf + 0xf)
            );
  Value::setString(this_00,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::allocator<char>::~allocator((allocator<char> *)(statement.field_2._M_local_buf + 0xf));
  statement.field_2._M_local_buf[0xe] = '\x01';
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  statement.field_2._M_local_buf[0xe] =
       OpenDDLExportMock::writeValueTester
                 ((OpenDDLExportMock *)tempString,local_30,(string *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_98,(bool)statement.field_2._M_local_buf[0xe]);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_98,(AssertionResult *)"ok","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0xe8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_d8,"\"\\\"huhu\\\"\"","statement",(char (*) [7])"\"huhu\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  ValueAllocator::releasePrimData(&local_30);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  OpenDDLExportMock::~OpenDDLExportMock((OpenDDLExportMock *)tempString);
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, writeStringTest) {
    OpenDDLExportMock myExport;
    char tempString[] = "huhu";
    Value *v = ValueAllocator::allocPrimData(Value::ValueType::ddl_string, sizeof(tempString));
    v->setString(tempString);
    bool ok(true);
    std::string statement;
    ok = myExport.writeValueTester(v, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("\"huhu\"", statement);
    ValueAllocator::releasePrimData(&v);
}